

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inftrees.c
# Opt level: O1

int inflate_table(codetype type,unsigned_short *lens,uint codes,code **table,uint *bits,
                 unsigned_short *work)

{
  ushort *puVar1;
  code *pcVar2;
  uchar uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  ushort uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  code *pcVar23;
  bool bVar24;
  unsigned_short offs [16];
  uint local_cc;
  unsigned_short *local_b0;
  unsigned_short *local_a8;
  ushort local_88 [20];
  uint *local_60;
  ushort auStack_58 [20];
  unsigned_short count [16];
  
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  if (codes != 0) {
    uVar13 = 0;
    do {
      local_88[lens[uVar13]] = local_88[lens[uVar13]] + 1;
      uVar13 = uVar13 + 1;
    } while (codes != uVar13);
  }
  if (local_88[0xf] == 0) {
    uVar22 = 0xe;
    do {
      uVar4 = uVar22;
      bVar24 = uVar4 == 0;
      if (bVar24) {
        uVar4 = 0;
        break;
      }
      uVar22 = uVar4 - 1;
    } while (local_88[uVar4] == 0);
  }
  else {
    uVar4 = 0xf;
    bVar24 = false;
  }
  uVar22 = *bits;
  if (uVar4 <= *bits) {
    uVar22 = uVar4;
  }
  if (bVar24) {
    pcVar23 = *table;
    *table = pcVar23 + 1;
    pcVar23->op = '@';
    pcVar23->bits = '\x01';
    pcVar23->val = 0;
    pcVar23 = *table;
    *table = pcVar23 + 1;
    pcVar23->op = '@';
    pcVar23->bits = '\x01';
    pcVar23->val = 0;
    uVar22 = 1;
LAB_0010aadb:
    *bits = uVar22;
    iVar7 = 0;
  }
  else {
    iVar10 = 1;
    uVar13 = 1;
    if (1 < uVar4) {
      uVar13 = 1;
      do {
        if (local_88[uVar13] != 0) goto LAB_0010ab1d;
        uVar13 = uVar13 + 1;
      } while (uVar4 != uVar13);
      uVar13 = (ulong)uVar4;
    }
LAB_0010ab1d:
    if (uVar22 <= (uint)uVar13) {
      uVar22 = (uint)uVar13;
    }
    lVar19 = 1;
    do {
      iVar10 = iVar10 * 2 - (uint)local_88[lVar19];
      iVar7 = -1;
      if (iVar10 < 0) {
        return -1;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x10);
    local_60 = bits;
    if ((iVar10 == 0) || ((type != CODES && (uVar4 == 1)))) {
      auStack_58[1] = 0;
      lVar19 = 0;
      uVar9 = 0;
      do {
        uVar9 = uVar9 + local_88[lVar19 + 1];
        auStack_58[lVar19 + 2] = uVar9;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0xe);
      if (codes != 0) {
        uVar14 = 0;
        do {
          uVar17 = (ulong)lens[uVar14];
          if (uVar17 != 0) {
            uVar9 = auStack_58[uVar17];
            auStack_58[uVar17] = uVar9 + 1;
            work[uVar9] = (unsigned_short)uVar14;
          }
          uVar14 = uVar14 + 1;
        } while (codes != uVar14);
      }
      if (type == CODES) {
        uVar20 = 0x14;
        local_b0 = work;
        local_a8 = work;
      }
      else if (type == LENS) {
        uVar20 = 0x101;
        local_a8 = inflate_table::lext;
        local_b0 = inflate_table::lbase;
      }
      else {
        uVar20 = 0;
        local_a8 = inflate_table::dext;
        local_b0 = inflate_table::dbase;
      }
      iVar7 = 1;
      uVar15 = 1 << ((byte)uVar22 & 0x1f);
      if (((type != LENS) || (uVar22 < 10)) && ((type != DISTS || (uVar22 < 10)))) {
        uVar5 = uVar15 - 1;
        pcVar23 = *table;
        local_cc = 0xffffffff;
        uVar14 = 0;
        uVar21 = 0;
        uVar12 = 0;
        uVar11 = uVar22;
        do {
          uVar6 = 1 << ((byte)uVar11 & 0x1f);
          do {
            uVar9 = work[uVar14];
            if (uVar9 + 1 < uVar20) {
              uVar3 = '\0';
            }
            else {
              uVar11 = uVar9 - uVar20;
              if (uVar9 < uVar20) {
                uVar3 = '`';
                uVar9 = 0;
              }
              else {
                uVar3 = (uchar)local_a8[uVar11];
                uVar9 = local_b0[uVar11];
              }
            }
            bVar8 = (char)uVar13 - (byte)uVar21;
            iVar10 = -1 << (bVar8 & 0x1f);
            uVar11 = uVar6;
            do {
              uVar18 = (uVar12 >> ((byte)uVar21 & 0x1f)) + iVar10 + uVar11;
              pcVar23[uVar18].op = uVar3;
              pcVar23[uVar18].bits = bVar8;
              pcVar23[uVar18].val = uVar9;
              uVar11 = uVar11 + iVar10;
            } while (uVar11 != 0);
            uVar11 = 1 << ((char)uVar13 - 1U & 0x1f);
            do {
              uVar18 = uVar11;
              uVar11 = uVar18 >> 1;
            } while ((uVar18 & uVar12) != 0);
            uVar12 = (uVar18 - 1 & uVar12) + uVar18;
            if (uVar18 == 0) {
              uVar12 = 0;
            }
            uVar14 = (ulong)((int)uVar14 + 1);
            puVar1 = local_88 + (uVar13 & 0xffffffff);
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) {
              if ((uint)uVar13 == uVar4) {
                if (uVar12 != 0) {
                  pcVar23[uVar12].op = '@';
                  pcVar23[uVar12].bits = bVar8;
                  pcVar23[uVar12].val = 0;
                }
                *table = *table + uVar15;
                bits = local_60;
                goto LAB_0010aadb;
              }
              uVar13 = (ulong)lens[work[uVar14]];
            }
            uVar18 = (uint)uVar13;
          } while ((uVar18 <= uVar22) || (uVar16 = uVar12 & uVar5, uVar16 == local_cc));
          if (uVar21 == 0) {
            uVar21 = uVar22;
          }
          uVar11 = uVar18 - uVar21;
          if (uVar18 < uVar4) {
            iVar10 = 1 << ((byte)uVar11 & 0x1f);
            uVar11 = uVar4 - uVar21;
            uVar17 = uVar13 & 0xffffffff;
            do {
              iVar7 = iVar10 - (uint)local_88[uVar17];
              if (iVar7 == 0 || iVar10 < (int)(uint)local_88[uVar17]) {
                uVar11 = (int)uVar17 - uVar21;
                break;
              }
              iVar10 = iVar7 * 2;
              uVar18 = (int)uVar17 + 1;
              uVar17 = (ulong)uVar18;
            } while (uVar18 < uVar4);
          }
          uVar15 = uVar15 + (1 << ((byte)uVar11 & 0x1f));
          if (type == LENS && 0x354 < uVar15) {
            return 1;
          }
          if (type == DISTS && 0x250 < uVar15) {
            return 1;
          }
          pcVar23 = pcVar23 + uVar6;
          pcVar2 = *table;
          pcVar2[uVar16].op = (byte)uVar11;
          pcVar2[uVar16].bits = (byte)uVar22;
          pcVar2[uVar16].val = (unsigned_short)((uint)((int)pcVar23 - (int)pcVar2) >> 2);
          local_cc = uVar16;
        } while( true );
      }
    }
  }
  return iVar7;
}

Assistant:

int ZLIB_INTERNAL inflate_table(type, lens, codes, table, bits, work)
codetype type;
unsigned short FAR *lens;
unsigned codes;
code FAR * FAR *table;
unsigned FAR *bits;
unsigned short FAR *work;
{
    unsigned len;               /* a code's length in bits */
    unsigned sym;               /* index of code symbols */
    unsigned min, max;          /* minimum and maximum code lengths */
    unsigned root;              /* number of index bits for root table */
    unsigned curr;              /* number of index bits for current table */
    unsigned drop;              /* code bits to drop for sub-table */
    int left;                   /* number of prefix codes available */
    unsigned used;              /* code entries in table used */
    unsigned huff;              /* Huffman code */
    unsigned incr;              /* for incrementing code, index */
    unsigned fill;              /* index for replicating entries */
    unsigned low;               /* low bits for current root entry */
    unsigned mask;              /* mask for low root bits */
    code here;                  /* table entry for duplication */
    code FAR *next;             /* next available space in table */
    const unsigned short FAR *base;     /* base value table to use */
    const unsigned short FAR *extra;    /* extra bits table to use */
    unsigned match;             /* use base and extra for symbol >= match */
    unsigned short count[MAXBITS+1];    /* number of codes of each length */
    unsigned short offs[MAXBITS+1];     /* offsets in table for each length */
    static const unsigned short lbase[31] = { /* Length codes 257..285 base */
        3, 4, 5, 6, 7, 8, 9, 10, 11, 13, 15, 17, 19, 23, 27, 31,
        35, 43, 51, 59, 67, 83, 99, 115, 131, 163, 195, 227, 258, 0, 0};
    static const unsigned short lext[31] = { /* Length codes 257..285 extra */
        16, 16, 16, 16, 16, 16, 16, 16, 17, 17, 17, 17, 18, 18, 18, 18,
        19, 19, 19, 19, 20, 20, 20, 20, 21, 21, 21, 21, 16, 77, 202};
    static const unsigned short dbase[32] = { /* Distance codes 0..29 base */
        1, 2, 3, 4, 5, 7, 9, 13, 17, 25, 33, 49, 65, 97, 129, 193,
        257, 385, 513, 769, 1025, 1537, 2049, 3073, 4097, 6145,
        8193, 12289, 16385, 24577, 0, 0};
    static const unsigned short dext[32] = { /* Distance codes 0..29 extra */
        16, 16, 16, 16, 17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22,
        23, 23, 24, 24, 25, 25, 26, 26, 27, 27,
        28, 28, 29, 29, 64, 64};

    /*
       Process a set of code lengths to create a canonical Huffman code.  The
       code lengths are lens[0..codes-1].  Each length corresponds to the
       symbols 0..codes-1.  The Huffman code is generated by first sorting the
       symbols by length from short to long, and retaining the symbol order
       for codes with equal lengths.  Then the code starts with all zero bits
       for the first code of the shortest length, and the codes are integer
       increments for the same length, and zeros are appended as the length
       increases.  For the deflate format, these bits are stored backwards
       from their more natural integer increment ordering, and so when the
       decoding tables are built in the large loop below, the integer codes
       are incremented backwards.

       This routine assumes, but does not check, that all of the entries in
       lens[] are in the range 0..MAXBITS.  The caller must assure this.
       1..MAXBITS is interpreted as that code length.  zero means that that
       symbol does not occur in this code.

       The codes are sorted by computing a count of codes for each length,
       creating from that a table of starting indices for each length in the
       sorted table, and then entering the symbols in order in the sorted
       table.  The sorted table is work[], with that space being provided by
       the caller.

       The length counts are used for other purposes as well, i.e. finding
       the minimum and maximum length codes, determining if there are any
       codes at all, checking for a valid set of lengths, and looking ahead
       at length counts to determine sub-table sizes when building the
       decoding tables.
     */

    /* accumulate lengths for codes (assumes lens[] all in 0..MAXBITS) */
    for (len = 0; len <= MAXBITS; len++)
        count[len] = 0;
    for (sym = 0; sym < codes; sym++)
        count[lens[sym]]++;

    /* bound code lengths, force root to be within code lengths */
    root = *bits;
    for (max = MAXBITS; max >= 1; max--)
        if (count[max] != 0) break;
    if (root > max) root = max;
    if (max == 0) {                     /* no symbols to code at all */
        here.op = (unsigned char)64;    /* invalid code marker */
        here.bits = (unsigned char)1;
        here.val = (unsigned short)0;
        *(*table)++ = here;             /* make a table to force an error */
        *(*table)++ = here;
        *bits = 1;
        return 0;     /* no symbols, but wait for decoding to report error */
    }
    for (min = 1; min < max; min++)
        if (count[min] != 0) break;
    if (root < min) root = min;

    /* check for an over-subscribed or incomplete set of lengths */
    left = 1;
    for (len = 1; len <= MAXBITS; len++) {
        left <<= 1;
        left -= count[len];
        if (left < 0) return -1;        /* over-subscribed */
    }
    if (left > 0 && (type == CODES || max != 1))
        return -1;                      /* incomplete set */

    /* generate offsets into symbol table for each length for sorting */
    offs[1] = 0;
    for (len = 1; len < MAXBITS; len++)
        offs[len + 1] = offs[len] + count[len];

    /* sort symbols by length, by symbol order within each length */
    for (sym = 0; sym < codes; sym++)
        if (lens[sym] != 0) work[offs[lens[sym]]++] = (unsigned short)sym;

    /*
       Create and fill in decoding tables.  In this loop, the table being
       filled is at next and has curr index bits.  The code being used is huff
       with length len.  That code is converted to an index by dropping drop
       bits off of the bottom.  For codes where len is less than drop + curr,
       those top drop + curr - len bits are incremented through all values to
       fill the table with replicated entries.

       root is the number of index bits for the root table.  When len exceeds
       root, sub-tables are created pointed to by the root entry with an index
       of the low root bits of huff.  This is saved in low to check for when a
       new sub-table should be started.  drop is zero when the root table is
       being filled, and drop is root when sub-tables are being filled.

       When a new sub-table is needed, it is necessary to look ahead in the
       code lengths to determine what size sub-table is needed.  The length
       counts are used for this, and so count[] is decremented as codes are
       entered in the tables.

       used keeps track of how many table entries have been allocated from the
       provided *table space.  It is checked for LENS and DIST tables against
       the constants ENOUGH_LENS and ENOUGH_DISTS to guard against changes in
       the initial root table size constants.  See the comments in inftrees.h
       for more information.

       sym increments through all symbols, and the loop terminates when
       all codes of length max, i.e. all codes, have been processed.  This
       routine permits incomplete codes, so another loop after this one fills
       in the rest of the decoding tables with invalid code markers.
     */

    /* set up for code type */
    switch (type) {
    case CODES:
        base = extra = work;    /* dummy value--not used */
        match = 20;
        break;
    case LENS:
        base = lbase;
        extra = lext;
        match = 257;
        break;
    default:    /* DISTS */
        base = dbase;
        extra = dext;
        match = 0;
    }

    /* initialize state for loop */
    huff = 0;                   /* starting code */
    sym = 0;                    /* starting code symbol */
    len = min;                  /* starting code length */
    next = *table;              /* current table to fill in */
    curr = root;                /* current table index bits */
    drop = 0;                   /* current bits to drop from code for index */
    low = (unsigned)(-1);       /* trigger new sub-table when len > root */
    used = 1U << root;          /* use root table entries */
    mask = used - 1;            /* mask for comparing low */

    /* check available table space */
    if ((type == LENS && used > ENOUGH_LENS) ||
        (type == DISTS && used > ENOUGH_DISTS))
        return 1;

    /* process all codes and make table entries */
    for (;;) {
        /* create table entry */
        here.bits = (unsigned char)(len - drop);
        if (work[sym] + 1U < match) {
            here.op = (unsigned char)0;
            here.val = work[sym];
        }
        else if (work[sym] >= match) {
            here.op = (unsigned char)(extra[work[sym] - match]);
            here.val = base[work[sym] - match];
        }
        else {
            here.op = (unsigned char)(32 + 64);         /* end of block */
            here.val = 0;
        }

        /* replicate for those indices with low len bits equal to huff */
        incr = 1U << (len - drop);
        fill = 1U << curr;
        min = fill;                 /* save offset to next table */
        do {
            fill -= incr;
            next[(huff >> drop) + fill] = here;
        } while (fill != 0);

        /* backwards increment the len-bit code huff */
        incr = 1U << (len - 1);
        while (huff & incr)
            incr >>= 1;
        if (incr != 0) {
            huff &= incr - 1;
            huff += incr;
        }
        else
            huff = 0;

        /* go to next symbol, update count, len */
        sym++;
        if (--(count[len]) == 0) {
            if (len == max) break;
            len = lens[work[sym]];
        }

        /* create new sub-table if needed */
        if (len > root && (huff & mask) != low) {
            /* if first time, transition to sub-tables */
            if (drop == 0)
                drop = root;

            /* increment past last table */
            next += min;            /* here min is 1 << curr */

            /* determine length of next table */
            curr = len - drop;
            left = (int)(1 << curr);
            while (curr + drop < max) {
                left -= count[curr + drop];
                if (left <= 0) break;
                curr++;
                left <<= 1;
            }

            /* check for enough space */
            used += 1U << curr;
            if ((type == LENS && used > ENOUGH_LENS) ||
                (type == DISTS && used > ENOUGH_DISTS))
                return 1;

            /* point entry in root table to sub-table */
            low = huff & mask;
            (*table)[low].op = (unsigned char)curr;
            (*table)[low].bits = (unsigned char)root;
            (*table)[low].val = (unsigned short)(next - *table);
        }
    }

    /* fill in remaining table entry if code is incomplete (guaranteed to have
       at most one remaining entry, since if the code is incomplete, the
       maximum code length that was allowed to get this far is one bit) */
    if (huff != 0) {
        here.op = (unsigned char)64;            /* invalid code marker */
        here.bits = (unsigned char)(len - drop);
        here.val = (unsigned short)0;
        next[huff] = here;
    }

    /* set return parameters */
    *table += used;
    *bits = root;
    return 0;
}